

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

bool __thiscall QFormLayout::isRowVisible(QFormLayout *this,QWidget *widget)

{
  bool bVar1;
  int index;
  long in_FS_OFFSET;
  ItemRole role;
  int row;
  char local_50 [24];
  char *local_38;
  ItemRole local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLayoutPrivate::checkWidget(*(QLayoutPrivate **)&(this->super_QLayout).field_0x8,widget);
  if (bVar1) {
    local_2c = -0x55555556;
    local_30 = 0xaaaaaaaa;
    index = (**(code **)(*(long *)&this->super_QLayout + 0xb8))(this,widget);
    getItemPosition(this,index,&local_2c,&local_30);
    if (local_2c < 0) {
      local_50[0] = '\x02';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[0x14] = '\0';
      local_50[0x15] = '\0';
      local_50[0x16] = '\0';
      local_50[0x17] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      local_50[8] = '\0';
      local_50[9] = '\0';
      local_50[10] = '\0';
      local_50[0xb] = '\0';
      local_50[0xc] = '\0';
      local_50[0xd] = '\0';
      local_50[0xe] = '\0';
      local_50[0xf] = '\0';
      local_50[0x10] = '\0';
      local_50[0x11] = '\0';
      local_50[0x12] = '\0';
      local_50[0x13] = '\0';
      local_38 = "default";
      bVar1 = false;
      QMessageLogger::warning(local_50,"QFormLayout::takeRow: Invalid widget");
    }
    else {
      bVar1 = isRowVisible(this,local_2c);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayout::isRowVisible(QWidget *widget) const
{
    Q_D(const QFormLayout);
    if (Q_UNLIKELY(!d->checkWidget(widget)))
        return false;
    int row;
    ItemRole role;
    getWidgetPosition(widget, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::takeRow: Invalid widget");
        return false;
    }

    return isRowVisible(row);
}